

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O1

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btVector3 *pivotInA,btVector3 *axisInA,
          bool useReferenceFrameA)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_002282b0;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  fVar6 = axisInA->m_floats[2];
  if (ABS(fVar6) <= 0.70710677) {
    fVar6 = axisInA->m_floats[0] * axisInA->m_floats[0] +
            axisInA->m_floats[1] * axisInA->m_floats[1];
    if (fVar6 < 0.0) {
      fVar10 = sqrtf(fVar6);
    }
    else {
      fVar10 = SQRT(fVar6);
    }
    fVar17 = 0.0;
    fVar10 = 1.0 / fVar10;
    fVar18 = (float)((ulong)*(undefined8 *)(axisInA->m_floats + 1) >> 0x20);
    fVar4 = axisInA->m_floats[0] * fVar10;
    bVar8 = fVar6 * fVar10;
    fVar10 = fVar10 * -(float)*(undefined8 *)(axisInA->m_floats + 1);
    fVar6 = fVar4 * -fVar18;
    fVar18 = fVar18 * fVar10;
  }
  else {
    fVar6 = axisInA->m_floats[1] * axisInA->m_floats[1] + fVar6 * fVar6;
    if (fVar6 < 0.0) {
      fVar4 = sqrtf(fVar6);
    }
    else {
      fVar4 = SQRT(fVar6);
    }
    fVar4 = 1.0 / fVar4;
    fVar17 = axisInA->m_floats[1] * fVar4;
    fVar6 = fVar6 * fVar4;
    fVar4 = fVar4 * -axisInA->m_floats[2];
    fVar18 = fVar17 * -axisInA->m_floats[0];
    bVar8 = axisInA->m_floats[0] * fVar4;
    fVar10 = 0.0;
  }
  uVar2 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar2;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[0] = fVar10;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[1] = fVar6;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[2] = axisInA->m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_rbAFrame).m_basis.m_el[1].m_floats = CONCAT44(fVar18,fVar4);
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[2] = axisInA->m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] = fVar17;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] = bVar8;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[2] = axisInA->m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  fVar6 = axisInA->m_floats[0];
  fVar19 = (float)*(undefined8 *)(axisInA->m_floats + 1);
  fVar7 = (float)((ulong)*(undefined8 *)(axisInA->m_floats + 1) >> 0x20);
  fVar13 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar7 +
           (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] * fVar6 +
           (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] * fVar19;
  fVar14 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] * fVar7 +
           fVar6 * (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] +
           fVar19 * (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  fVar16 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar7 +
           fVar6 * (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
           fVar19 * (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  fVar18 = fVar7 * fVar14 + fVar16 * fVar6 + fVar19 * fVar13;
  if (-0.9999999 <= fVar18) {
    fVar18 = fVar18 + 1.0;
    fVar18 = fVar18 + fVar18;
    if (fVar18 < 0.0) {
      fVar18 = sqrtf(fVar18);
    }
    else {
      fVar18 = SQRT(fVar18);
    }
    fVar9 = 1.0 / fVar18;
    fVar12 = fVar9 * (fVar19 * fVar14 + fVar13 * -fVar7);
    fVar7 = fVar9 * (fVar7 * fVar16 + fVar14 * -fVar6);
    fVar9 = fVar9 * (fVar6 * fVar13 - fVar16 * fVar19);
    fVar18 = fVar18 * 0.5;
  }
  else {
    if (ABS(fVar7) <= 0.70710677) {
      fVar6 = fVar6 * fVar6 + fVar19 * fVar19;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      fVar9 = 0.0;
      fVar12 = -axisInA->m_floats[1] * (1.0 / fVar6);
      fVar7 = (1.0 / fVar6) * axisInA->m_floats[0];
    }
    else {
      fVar6 = fVar19 * fVar19 + fVar7 * fVar7;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      fVar12 = 0.0;
      fVar7 = -axisInA->m_floats[2] * (1.0 / fVar6);
      fVar9 = (1.0 / fVar6) * axisInA->m_floats[1];
    }
    fVar18 = 0.0;
  }
  fVar5 = (fVar18 * fVar4 + fVar10 * fVar9) - fVar12 * fVar17;
  fVar11 = (fVar18 * fVar17 + fVar4 * fVar12) - fVar7 * fVar10;
  fVar15 = (-fVar12 * fVar10 - fVar4 * fVar7) - fVar17 * fVar9;
  fVar6 = pivotInA->m_floats[1];
  fVar19 = pivotInA->m_floats[0];
  fVar1 = pivotInA->m_floats[2];
  uVar2 = *(undefined8 *)(rbA->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  auVar3._4_4_ = (float)((ulong)uVar2 >> 0x20) +
                 (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar1
                 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] *
                   fVar19 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                            [1] * fVar6;
  auVar3._0_4_ = (float)uVar2 +
                 (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar1
                 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] *
                   fVar19 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                            [1] * fVar6;
  auVar3._8_4_ = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] * fVar1
                 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] *
                   fVar19 + (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                            [1] * fVar6 +
                 (rbA->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_rbBFrame).m_origin.m_floats = auVar3;
  fVar10 = (fVar18 * fVar10 + fVar17 * fVar7) - fVar4 * fVar9;
  fVar4 = fVar11 * fVar7 + ((fVar18 * fVar10 - fVar15 * fVar12) - fVar5 * fVar9);
  fVar6 = fVar5 * fVar12 + ((fVar18 * fVar11 - fVar15 * fVar9) - fVar7 * fVar10);
  fVar10 = fVar9 * fVar10 + ((fVar18 * fVar5 - fVar15 * fVar7) - fVar11 * fVar12);
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[2] = fVar16;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] = fVar4;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[1] = fVar13 * fVar6 - fVar10 * fVar14;
  *(ulong *)(this->m_rbBFrame).m_basis.m_el[1].m_floats =
       CONCAT44(fVar14 * fVar4 + -fVar16 * fVar6,fVar10);
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[2] = fVar13;
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[0] = fVar6;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[1] = fVar16 * fVar10 - fVar4 * fVar13;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[2] = fVar14;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  if (this->m_useReferenceFrameA == false) {
    bVar8 = 1.0;
  }
  else {
    bVar8 = -1.0;
  }
  this->m_referenceSign = bVar8;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,const btVector3& pivotInA,const btVector3& axisInA, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false), m_enableAngularMotor(false), 
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{

	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	// fixed axis in worldspace
	btVector3 rbAxisA1, rbAxisA2;
	btPlaneSpace1(axisInA, rbAxisA1, rbAxisA2);

	m_rbAFrame.getOrigin() = pivotInA;
	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btVector3 axisInB = rbA.getCenterOfMassTransform().getBasis() * axisInA;

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 = axisInB.cross(rbAxisB1);


	m_rbBFrame.getOrigin() = rbA.getCenterOfMassTransform()(pivotInA);
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}